

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O2

int Ivy_ManCheckChoices(Ivy_Man_t *p)

{
  Vec_Ptr_t *p_00;
  uint *puVar1;
  int i;
  uint *puVar2;
  
  i = 0;
  do {
    p_00 = p->pHaig->vObjs;
    if (p_00->nSize <= i) {
      return 1;
    }
    puVar1 = (uint *)Vec_PtrEntry(p_00,i);
    if ((puVar1 != (uint *)0x0) && (puVar1[3] != 0)) {
      puVar2 = *(uint **)(puVar1 + 0x12);
      if (((ulong)puVar2 & 1) != 0) {
        __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCheck.c"
                      ,0x108,"int Ivy_ManCheckChoices(Ivy_Man_t *)");
      }
      for (; (puVar2 != (uint *)0x0 && (puVar2 != puVar1));
          puVar2 = (uint *)(*(ulong *)(puVar2 + 0x12) & 0xfffffffffffffffe)) {
        if (1 < (int)puVar2[3]) {
          printf("Node %d has member %d in its equiv class with %d fanouts.\n",(ulong)*puVar1,
                 (ulong)*puVar2);
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Ivy_ManCheckChoices( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pTemp;
    int i;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        // count the number of nodes in the loop
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp && pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            if ( Ivy_ObjRefs(pTemp) > 1 )
                printf( "Node %d has member %d in its equiv class with %d fanouts.\n", pObj->Id, pTemp->Id, Ivy_ObjRefs(pTemp) );
    }
    return 1;
}